

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O3

QCborValue * __thiscall
QJsonPrivate::Parser::parseNumber(QCborValue *__return_storage_ptr__,Parser *this)

{
  byte *pbVar1;
  qlonglong qVar2;
  byte *pbVar3;
  long lVar4;
  bool bVar5;
  byte *pbVar6;
  byte *pbVar7;
  long in_FS_OFFSET;
  double dVar8;
  bool ok;
  bool local_31;
  QByteArray local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.ptr = this->json;
  pbVar1 = (byte *)this->end;
  pbVar7 = (byte *)local_30.d.ptr;
  if ((local_30.d.ptr < pbVar1) && (*local_30.d.ptr == 0x2d)) {
    pbVar7 = (byte *)local_30.d.ptr + 1;
    this->json = (char *)pbVar7;
  }
  pbVar3 = pbVar7;
  if (pbVar7 < pbVar1) {
    if (*pbVar7 == 0x30) {
      this->json = (char *)(pbVar7 + 1);
      pbVar3 = pbVar7 + 1;
    }
    else {
      lVar4 = (long)pbVar1 - (long)pbVar7;
      do {
        pbVar3 = pbVar7;
        if (9 < (int)(char)*pbVar7 - 0x30U) break;
        pbVar7 = pbVar7 + 1;
        this->json = (char *)pbVar7;
        lVar4 = lVar4 + -1;
        pbVar3 = pbVar1;
      } while (lVar4 != 0);
    }
  }
  bVar5 = true;
  pbVar7 = pbVar3;
  if ((pbVar3 < pbVar1) && (*pbVar3 == 0x2e)) {
    pbVar6 = pbVar3 + 1;
    this->json = (char *)pbVar6;
    pbVar7 = pbVar6;
    if (pbVar6 < pbVar1) {
      pbVar3 = pbVar1 + ~(ulong)pbVar3;
      bVar5 = true;
      do {
        pbVar7 = pbVar6;
        if (9 < (int)(char)*pbVar6 - 0x30U) break;
        bVar5 = (bool)(bVar5 & *pbVar6 == 0x30);
        pbVar6 = pbVar6 + 1;
        this->json = (char *)pbVar6;
        pbVar3 = pbVar3 + -1;
        pbVar7 = pbVar1;
      } while (pbVar3 != (byte *)0x0);
    }
  }
  if ((pbVar7 < pbVar1) && ((*pbVar7 | 0x20) == 0x65)) {
    pbVar3 = pbVar7 + 1;
    this->json = (char *)pbVar3;
    if ((pbVar3 < pbVar1) && ((*pbVar3 == 0x2d || (*pbVar3 == 0x2b)))) {
      this->json = (char *)(pbVar7 + 2);
      pbVar3 = pbVar7 + 2;
    }
    pbVar7 = pbVar3;
    if (pbVar7 < pbVar1) {
      lVar4 = (long)pbVar1 - (long)pbVar7;
      do {
        if (9 < (int)(char)*pbVar7 - 0x30U) goto LAB_002f3a93;
        pbVar7 = pbVar7 + 1;
        this->json = (char *)pbVar7;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      bVar5 = false;
      pbVar7 = pbVar1;
    }
    else {
LAB_002f3a93:
      bVar5 = false;
    }
  }
  local_30.d.size = (long)pbVar7 - (long)local_30.d.ptr;
  local_30.d.d = (Data *)0x0;
  if (bVar5) {
    local_31 = true;
    qVar2 = QByteArray::toLongLong(&local_30,&local_31,10);
    if (local_31 != true) goto LAB_002f3acf;
  }
  else {
LAB_002f3acf:
    local_31 = true;
    dVar8 = QByteArray::toDouble(&local_30,&local_31);
    if (local_31 == false) {
      this->lastError = IllegalNumber;
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      __return_storage_ptr__->t = Undefined;
      goto LAB_002f3b5e;
    }
    qVar2 = (qlonglong)dVar8;
    if (dVar8 != (double)qVar2) {
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      __return_storage_ptr__->t = Double;
      __return_storage_ptr__->n = (qint64)dVar8;
      goto LAB_002f3b5e;
    }
  }
  __return_storage_ptr__->n = qVar2;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Integer;
LAB_002f3b5e:
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue Parser::parseNumber()
{
    const char *start = json;
    bool isInt = true;

    // minus
    if (json < end && *json == '-')
        ++json;

    // int = zero / ( digit1-9 *DIGIT )
    if (json < end && *json == '0') {
        ++json;
    } else {
        while (json < end && isAsciiDigit(*json))
            ++json;
    }

    // frac = decimal-point 1*DIGIT
    if (json < end && *json == '.') {
        ++json;
        while (json < end && isAsciiDigit(*json)) {
            isInt = isInt && *json == '0';
            ++json;
        }
    }

    // exp = e [ minus / plus ] 1*DIGIT
    if (json < end && (*json == 'e' || *json == 'E')) {
        isInt = false;
        ++json;
        if (json < end && (*json == '-' || *json == '+'))
            ++json;
        while (json < end && isAsciiDigit(*json))
            ++json;
    }

    const QByteArray number = QByteArray::fromRawData(start, json - start);

    if (isInt) {
        bool ok;
        qlonglong n = number.toLongLong(&ok);
        if (ok) {
            return QCborValue(n);
        }
    }

    bool ok;
    double d = number.toDouble(&ok);

    if (!ok) {
        lastError = QJsonParseError::IllegalNumber;
        return QCborValue();
    }

    qint64 n;
    if (convertDoubleTo(d, &n))
        return QCborValue(n);
    return QCborValue(d);
}